

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int EventFilter20to12(void *data,SDL_Event *event20)

{
  ushort uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  code *pcVar4;
  undefined2 uVar5;
  SDL20_memcpy_t p_Var6;
  Uint8 UVar7;
  undefined2 uVar8;
  SDL12Key SVar9;
  Uint32 UVar10;
  int iVar11;
  SDL_version *pSVar12;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int which_5;
  int which_4;
  int which_3;
  int which_2;
  int which_1;
  int which;
  int codePoint;
  char *text;
  char *keyName;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  Uint32 flags;
  SDL_AssertState sdl_assert_state;
  SDL12_SysWMmsg msg;
  SDL12_Event event12;
  SDL_Event *event20_local;
  void *data_local;
  
  do {
    if (data == (void *)0x0) goto LAB_00119944;
    sdl_assert_state_1 =
         (*SDL20_ReportAssertion)
                   (&EventFilter20to12::sdl_assert_data,"EventFilter20to12",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                    ,0x12a0);
  } while (sdl_assert_state_1 == SDL_ASSERTION_RETRY);
  if (sdl_assert_state_1 == SDL_ASSERTION_BREAK) {
    pcVar4 = (code *)swi(3);
    iVar11 = (*pcVar4)();
    return iVar11;
  }
LAB_00119944:
  (*SDL20_memset)((void *)((long)&msg.event + 0xb8),0,0x18);
  UVar10 = event20->type;
  if (UVar10 == 0x100) {
    msg.event._184_1_ = 0xc;
  }
  else if (UVar10 == 0x200) {
    if (VideoWindow20 != (SDL_Window *)0x0) {
      switch((event20->display).event) {
      case '\x01':
      case '\x03':
        if (SetVideoModeInProgress == SDL_FALSE) {
          msg.event._184_1_ = 0x11;
        }
        break;
      case '\x05':
        sdl_assert_state_2 = (*SDL20_GetWindowFlags)(VideoWindow20);
        if ((sdl_assert_state_2 & 0x1001) != 0x1001) {
          msg.event._184_1_ = 0x10;
          msg.event._188_4_ = (event20->display).data1;
        }
        break;
      case '\a':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 0;
        msg.event._186_1_ = 4;
        break;
      case '\t':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 1;
        msg.event._186_1_ = 4;
        break;
      case '\n':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 1;
        msg.event._186_1_ = 1;
        break;
      case '\v':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 0;
        msg.event._186_1_ = 1;
        break;
      case '\f':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 1;
        msg.event._186_1_ = 2;
        break;
      case '\r':
        msg.event._184_1_ = 1;
        msg.event._185_1_ = 0;
        msg.event._186_1_ = 2;
      }
    }
  }
  else if (UVar10 == 0x201) {
    if (SupportSysWM == SDL_FALSE) {
      return 1;
    }
    do {
      if (((event20->syswm).msg)->subsystem == SDL_SYSWM_X11) goto LAB_00119c13;
      keyName._4_4_ =
           (*SDL20_ReportAssertion)
                     (&EventFilter20to12::sdl_assert_data_1,"EventFilter20to12",
                      "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                      ,0x1302);
    } while (keyName._4_4_ == SDL_ASSERTION_RETRY);
    if (keyName._4_4_ == SDL_ASSERTION_BREAK) {
      pcVar4 = (code *)swi(3);
      iVar11 = (*pcVar4)();
      return iVar11;
    }
LAB_00119c13:
    sdl_assert_state = SDL_ASSERTION_RETRY;
    (*SDL20_memcpy)(&msg,&((event20->syswm).msg)->msg,0xc0);
    p_Var6 = SDL20_memcpy;
    pSVar12 = SDL_Linked_Version();
    (*p_Var6)(&flags,pSVar12,3);
    msg.event._184_1_ = 0xd;
  }
  else {
    if (UVar10 == 0x300) {
      FlushPendingKeydownEvent(0);
      if ((event20->display).padding1 != '\0') {
        return 1;
      }
      if (TranslateKeyboardLayout == SDL_FALSE) {
        PendingKeydownEvent.key.keysym.sym = Scancode20toKeysym12((event20->key).keysym.scancode);
      }
      else {
        PendingKeydownEvent.key.keysym.sym = Keysym20to12((event20->window).data2);
      }
      KeyState[PendingKeydownEvent.key.keysym.sym] = (event20->display).event;
      PendingKeydownEvent.type = '\x03';
      if (event20->type == 0x300) {
        PendingKeydownEvent.type = '\x02';
      }
      PendingKeydownEvent.active.gain = '\0';
      PendingKeydownEvent.active.state = (event20->display).event;
      PendingKeydownEvent.key.keysym.scancode = Scancode20to12((event20->key).keysym.scancode);
      uVar1 = (event20->key).keysym.mod;
      PendingKeydownEvent.key.keysym.mod = (uint)uVar1;
      PendingKeydownEvent.key.keysym.unicode = 0;
      if (EnabledUnicode == 0) {
        FlushPendingKeydownEvent(0);
        return 1;
      }
      if (PendingKeydownEvent.key.keysym.sym == SDLK12_BACKSPACE) {
        FlushPendingKeydownEvent(8);
        return 1;
      }
      if (PendingKeydownEvent.key.keysym.sym != SDLK12_TAB) {
        if (PendingKeydownEvent.key.keysym.sym != SDLK12_RETURN) {
          if (PendingKeydownEvent.key.keysym.sym == SDLK12_ESCAPE) {
            FlushPendingKeydownEvent(0x1b);
            return 1;
          }
          if (PendingKeydownEvent.key.keysym.sym != SDLK12_KP_ENTER) {
            if ((uVar1 & 0xc0) == 0) {
              PendingKeydownEvent.key.keysym.unicode = 0;
              return 1;
            }
            text = SDL_GetKeyName(PendingKeydownEvent.key.keysym.sym);
            if ((*text != '\0') && (text[1] == '\0')) {
              FlushPendingKeydownEvent((int)*text);
              return 1;
            }
            FlushPendingKeydownEvent(0);
            return 1;
          }
        }
        if ((uVar1 & 3) != 0) {
          FlushPendingKeydownEvent(10);
          return 1;
        }
        FlushPendingKeydownEvent(0xd);
        return 1;
      }
      FlushPendingKeydownEvent(9);
      return 1;
    }
    if (UVar10 == 0x301) {
      if ((event20->display).padding1 != '\0') {
        return 1;
      }
      if (TranslateKeyboardLayout == SDL_FALSE) {
        SVar9 = Scancode20toKeysym12((event20->key).keysym.scancode);
      }
      else {
        SVar9 = Keysym20to12((event20->window).data2);
      }
      if (KeyRepeatNextTicks != 0) {
        do {
          if (KeyRepeatEvent.type == '\x02') goto LAB_00119d31;
          keyName._0_4_ =
               (*SDL20_ReportAssertion)
                         (&EventFilter20to12::sdl_assert_data_2,"EventFilter20to12",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                          ,0x131a);
        } while ((SDL_AssertState)keyName == SDL_ASSERTION_RETRY);
        if ((SDL_AssertState)keyName == SDL_ASSERTION_BREAK) {
          pcVar4 = (code *)swi(3);
          iVar11 = (*pcVar4)();
          return iVar11;
        }
LAB_00119d31:
        if (KeyRepeatEvent.key.keysym.sym == SVar9) {
          KeyRepeatNextTicks = 0;
        }
      }
      KeyState[SVar9] = (event20->display).event;
      msg.event._184_1_ = 3;
      msg.event._185_1_ = 0;
      msg.event._186_1_ = (event20->display).event;
      UVar7 = Scancode20to12((event20->key).keysym.scancode);
      msg.event._188_1_ = UVar7;
      FlushPendingKeydownEvent(0);
    }
    else {
      if (UVar10 == 0x302) {
        return 1;
      }
      if (UVar10 == 0x303) {
        _which = &(event20->display).event;
        UVar10 = DecodeUTF8Char((char **)&which);
        FlushPendingKeydownEvent(UVar10);
        return 1;
      }
      if (UVar10 == 0x400) {
        if (VideoSurface12 == (SDL12_Surface *)0x0) {
          return 1;
        }
        if (VideoSurface12->surface20 == (SDL_Surface *)0x0) {
          return 1;
        }
        msg.event._184_1_ = 4;
        msg.event._185_1_ = (undefined1)(event20->motion).which;
        msg.event._186_1_ = (undefined1)(event20->display).data1;
        AdjustOpenGLLogicalScalingPoint
                  (&(event20->window).data2,(int *)((event20->edit).text + 0xc));
        if ((event20->window).data2 < VideoSurface12->w) {
          local_160 = (event20->window).data2;
        }
        else {
          local_160 = VideoSurface12->w;
        }
        if (local_160 < 1) {
          local_168 = 0;
        }
        else {
          if ((event20->window).data2 < VideoSurface12->w) {
            local_164 = (event20->window).data2;
          }
          else {
            local_164 = VideoSurface12->w;
          }
          local_168 = local_164;
        }
        (event20->window).data2 = local_168;
        if ((event20->motion).y < VideoSurface12->h) {
          local_16c = (event20->motion).y;
        }
        else {
          local_16c = VideoSurface12->h;
        }
        if (local_16c < 1) {
          local_174 = 0;
        }
        else {
          if ((event20->motion).y < VideoSurface12->h) {
            local_170 = *(int *)&(event20->key).keysym.mod;
          }
          else {
            local_170 = VideoSurface12->h;
          }
          local_174 = local_170;
        }
        *(int *)&(event20->key).keysym.mod = local_174;
        msg.event._188_4_ =
             CONCAT22((short)*(undefined4 *)&(event20->key).keysym.mod,
                      (short)(event20->window).data2);
        if (UseMouseRelativeScaling != SDL_FALSE) {
          AdjustOpenGLLogicalScalingVector
                    ((int *)((event20->edit).text + 0x10),(int *)((event20->edit).text + 0x14),
                     &MouseRelativeRemainder.x,&MouseRelativeRemainder.y);
        }
        if (MouseInputIsRelative == SDL_FALSE) {
          MousePosition.x = msg.event._188_4_ & 0xffff;
          MousePosition.y = (uint)msg.event._188_4_ >> 0x10;
        }
        else {
          MousePosition.x = (event20->key).keysym.unused + MousePosition.x;
          if (MousePosition.x < 1) {
            MousePosition.x = 0;
          }
          else if (VideoSurface12->w <= MousePosition.x) {
            MousePosition.x = VideoSurface12->w + -1;
          }
          MousePosition.y = (event20->motion).yrel + MousePosition.y;
          if (MousePosition.y < 1) {
            MousePosition.y = 0;
          }
          else if (VideoSurface12->h <= MousePosition.y) {
            MousePosition.y = VideoSurface12->h + -1;
          }
          msg.event._188_4_ = CONCAT22((short)MousePosition.y,(short)MousePosition.x);
        }
      }
      else {
        uVar8 = (undefined2)MousePosition.y;
        uVar5 = (undefined2)MousePosition.x;
        if (UVar10 == 0x401) {
          msg.event._184_1_ = 5;
          uVar2 = *(Uint8 *)((long)event20 + 0xc);
          msg.event._186_1_ = (event20->button).button;
          if (3 < (byte)msg.event._186_1_) {
            msg.event._186_1_ = msg.event._186_1_ + 2;
          }
          msg.event._187_1_ = *(undefined1 *)((long)&(event20->display).data1 + 1);
          msg.event._185_1_ = uVar2;
          if (MouseInputIsRelative == SDL_FALSE) {
            AdjustOpenGLLogicalScalingPoint
                      (&(event20->window).data2,(int *)((event20->edit).text + 0xc));
            msg.event._188_4_ =
                 CONCAT22((short)*(undefined4 *)&(event20->key).keysym.mod,
                          (short)(event20->window).data2);
          }
          else {
            msg.event._188_4_ = CONCAT22(uVar8,uVar5);
          }
        }
        else if (UVar10 == 0x402) {
          msg.event._184_1_ = 6;
          uVar3 = *(Uint8 *)((long)event20 + 0xc);
          msg.event._186_1_ = (event20->button).button;
          if (3 < (byte)msg.event._186_1_) {
            msg.event._186_1_ = msg.event._186_1_ + 2;
          }
          msg.event._187_1_ = *(undefined1 *)((long)&(event20->display).data1 + 1);
          msg.event._185_1_ = uVar3;
          if (MouseInputIsRelative == SDL_FALSE) {
            AdjustOpenGLLogicalScalingPoint
                      (&(event20->window).data2,(int *)((event20->edit).text + 0xc));
            msg.event._188_4_ =
                 CONCAT22((short)*(undefined4 *)&(event20->key).keysym.mod,
                          (short)(event20->window).data2);
          }
          else {
            msg.event._188_4_ = CONCAT22(uVar8,uVar5);
          }
        }
        else if (UVar10 == 0x403) {
          if ((event20->window).data2 != 0) {
            msg.event._184_1_ = 5;
            msg.event._185_1_ = (undefined1)(event20->motion).which;
            msg.event._186_1_ = 5;
            if (0 < (event20->window).data2) {
              msg.event._186_1_ = 4;
            }
            msg.event._187_1_ = 1;
            msg.event._188_4_ = CONCAT22(uVar8,uVar5);
            PushEventIfNotFiltered((SDL12_Event *)((long)&msg.event + 0xb8));
            msg.event._184_1_ = 6;
            msg.event._187_1_ = 0;
          }
        }
        else if (UVar10 == 0x600) {
          if ((JoysticksAreGameControllers == SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 7;
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._188_2_ = (event20->jaxis).value;
          }
        }
        else if (UVar10 == 0x601) {
          if ((JoysticksAreGameControllers == SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 8;
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._188_4_ = (event20->display).data1;
          }
        }
        else if (UVar10 == 0x602) {
          if ((JoysticksAreGameControllers == SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 9;
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._187_1_ = (event20->display).padding1;
          }
        }
        else if (UVar10 - 0x603 < 2) {
          if ((JoysticksAreGameControllers == SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 0xb;
            if ((event20->display).padding1 != '\0') {
              msg.event._184_1_ = 10;
            }
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._187_1_ = (event20->display).padding1;
          }
        }
        else if (UVar10 == 0x650) {
          if ((JoysticksAreGameControllers != SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 7;
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._188_2_ = (event20->jaxis).value;
          }
        }
        else {
          if (1 < UVar10 - 0x651) {
            return 1;
          }
          if ((JoysticksAreGameControllers != SDL_FALSE) &&
             (iVar11 = FindJoystick12IndexByInstanceId((event20->jaxis).which), iVar11 != -1)) {
            msg.event._184_1_ = 0xb;
            if ((event20->display).padding1 != '\0') {
              msg.event._184_1_ = 10;
            }
            msg.event._185_1_ = (undefined1)iVar11;
            msg.event._186_1_ = (event20->display).event;
            msg.event._187_1_ = (event20->display).padding1;
          }
        }
      }
    }
  }
  PushEventIfNotFiltered((SDL12_Event *)((long)&msg.event + 0xb8));
  return 1;
}

Assistant:

static int SDLCALL
EventFilter20to12(void *data, SDL_Event *event20)
{
    SDL12_Event event12;
    SDL12_SysWMmsg msg;

    SDL_assert(data == NULL);  /* currently unused. */

    SDL20_zero(event12);

    switch (event20->type) {
        case SDL_QUIT:
            event12.type = SDL12_QUIT;
            break;

        case SDL_WINDOWEVENT:
            if (!VideoWindow20) {
                break;  /* no window? No event. */
            }

            switch (event20->window.event) {
                /* don't send an SDL12_QUIT event for SDL_WINDOWEVENT_CLOSE;
                   we only ever have a single window, so an SDL_QUIT will be
                   coming from SDL2 next anyhow, so just send that on. */

                case SDL_WINDOWEVENT_SHOWN:
                case SDL_WINDOWEVENT_EXPOSED:
                    /* drop these during window creation (see issue #229) */
                    if (!SetVideoModeInProgress) {
                        event12.type = SDL12_VIDEOEXPOSE;
                    }
                    break;

                case SDL_WINDOWEVENT_RESIZED: {
                    /* don't generate a VIDEORESIZE event based on SIZE_CHANGED
                       events: the recommended way to handle VIDEORESIZE is
                       with a new SDL_SetVideoMode() call, and creating a new
                       window generates a SIZE_CHANGED event, which leads to an
                       infinite loop. */

                    /* don't report VIDEORESIZE if we're fullscreen-desktop;
                       we're doing logical scaling and as far as the app is
                       concerned the window doesn't change. */
                    const Uint32 flags = SDL20_GetWindowFlags(VideoWindow20);
                    if ((flags & SDL_WINDOW_FULLSCREEN_DESKTOP) == SDL_WINDOW_FULLSCREEN_DESKTOP) {
                        break;
                    }

                    event12.type = SDL12_VIDEORESIZE;
                    event12.resize.w = event20->window.data1;
                    event12.resize.h = event20->window.data2;
                    break;
                }

                case SDL_WINDOWEVENT_MINIMIZED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_RESTORED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_ENTER:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_LEAVE:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_GAINED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_LOST:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;
            }
            break;

        case SDL_SYSWMEVENT:
            if (!SupportSysWM) {
                return 1;
            }

            #if defined(SDL_VIDEO_DRIVER_WINDOWS)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_WINDOWS);
                msg.hwnd = event20->syswm.msg->msg.win.hwnd;
                msg.msg = event20->syswm.msg->msg.win.msg;
                msg.wParam = event20->syswm.msg->msg.win.wParam;
                msg.lParam = event20->syswm.msg->msg.win.lParam;
            #elif defined(SDL_VIDEO_DRIVER_X11)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_X11);
                msg.subsystem = SDL12_SYSWM_X11;
                SDL20_memcpy(&msg.event.xevent, &event20->syswm.msg->msg.x11.event, sizeof (XEvent));
            #else
                SDL_assert(!"should have been caught by !SupportsSysWM test");
            #endif

            SDL20_memcpy(&msg.version, SDL_Linked_Version(), sizeof (msg.version));
            event12.type = SDL12_SYSWMEVENT;
            event12.syswm.msg = &msg;  /* this is stack-allocated, but we copy and update the pointer later. */
            break;

        case SDL_KEYUP:
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                event12.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                event12.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            if (KeyRepeatNextTicks) {
                SDL_assert(KeyRepeatEvent.type == SDL12_KEYDOWN);
                if (KeyRepeatEvent.key.keysym.sym == event12.key.keysym.sym) {
                    KeyRepeatNextTicks = 0;
                }
            }

            KeyState[event12.key.keysym.sym] = event20->key.state;

            event12.type = SDL12_KEYUP;
            event12.key.which = 0;
            event12.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            event12.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            event12.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            event12.key.keysym.unicode = 0;

            /* If there's a pending KEYDOWN event, flush it on KEYUP. */
            FlushPendingKeydownEvent(0);
            break;

        case SDL_KEYDOWN:
            FlushPendingKeydownEvent(0);
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                PendingKeydownEvent.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                PendingKeydownEvent.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            KeyState[PendingKeydownEvent.key.keysym.sym] = event20->key.state;

            PendingKeydownEvent.type = (event20->type == SDL_KEYDOWN) ? SDL12_KEYDOWN : SDL12_KEYUP;
            PendingKeydownEvent.key.which = 0;
            PendingKeydownEvent.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            PendingKeydownEvent.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            PendingKeydownEvent.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            PendingKeydownEvent.key.keysym.unicode = 0;

            /* If Unicode is not enabled, flush all KEYDOWN events immediately. */
            if (!EnabledUnicode) {
                FlushPendingKeydownEvent(0);
                return 1;
            }

            /* some programs rely on unicode values for these control characters */
            switch (PendingKeydownEvent.key.keysym.sym) {
                case SDLK12_BACKSPACE:
                    FlushPendingKeydownEvent('\b');
                    break;
                case SDLK12_TAB:
                    FlushPendingKeydownEvent('\t');
                    break;
                case SDLK12_RETURN:
                case SDLK12_KP_ENTER:
                    /* Enter: \r, Shift+Enter: \n */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_SHIFT)
                        FlushPendingKeydownEvent('\n');
                    else
                        FlushPendingKeydownEvent('\r');
                    break;
                case SDLK12_ESCAPE:
                    FlushPendingKeydownEvent(0x1B); /* '\e' */
                    break;
                default:
                    /* not a supported control character
                       when CTRL is pressed, text events aren't sent so use fallback for unicode */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_CTRL) {
                        const char *keyName = SDL_GetKeyName(PendingKeydownEvent.key.keysym.sym);
                        /* use key name as unicode if it's a single character */
                        if (keyName[0] && !keyName[1])
                            FlushPendingKeydownEvent(keyName[0]);
                        else
                            FlushPendingKeydownEvent(0);
                    }
                    break;
            }

            return 1;

        case SDL_TEXTEDITING: return 1;
        case SDL_TEXTINPUT: {
            char *text = event20->text.text;
            const int codePoint = DecodeUTF8Char(&text);
            FlushPendingKeydownEvent(codePoint);
            return 1;
        }

        case SDL_MOUSEMOTION:
            if (!VideoSurface12 || !VideoSurface12->surface20) {
                return 1;  /* we don't have a screen surface yet? Don't send this on to the app. */
            }

            event12.type = SDL12_MOUSEMOTION;
            event12.motion.which = (Uint8) event20->motion.which;
            event12.motion.state = event20->motion.state;
            AdjustOpenGLLogicalScalingPoint(&event20->motion.x, &event20->motion.y);
            /* Clamp the absolute position to the window dimensions. */
            event20->motion.x = SDL_max(SDL_min(event20->motion.x, VideoSurface12->w), 0);
            event20->motion.y = SDL_max(SDL_min(event20->motion.y, VideoSurface12->h), 0);
            event12.motion.x = (Uint16) event20->motion.x;
            event12.motion.y = (Uint16) event20->motion.y;
            if (UseMouseRelativeScaling) {
                AdjustOpenGLLogicalScalingVector(&event20->motion.xrel,
                                                 &event20->motion.yrel,
                                                 &MouseRelativeRemainder.x,
                                                 &MouseRelativeRemainder.y);
            }
            event12.motion.xrel = (Sint16) event20->motion.xrel;
            event12.motion.yrel = (Sint16) event20->motion.yrel;
            if (MouseInputIsRelative) {
                /* in relative mode, clamp fake absolute position to the window dimensions. */
                #define ADJUST_RELATIVE(axis, rel, dim) { \
                    MousePosition.axis += event20->motion.rel; \
                    if (MousePosition.axis <= 0) { \
                        MousePosition.axis = 0; \
                    } else if (MousePosition.axis >= VideoSurface12->dim) { \
                        MousePosition.axis = (VideoSurface12->dim - 1); \
                    } \
                    event12.motion.axis = MousePosition.axis; \
                }
                ADJUST_RELATIVE(x, xrel, w);
                ADJUST_RELATIVE(y, yrel, h);
                #undef ADJUST_RELATIVE
            } else {
                MousePosition.x = event12.motion.x;
                MousePosition.y = event12.motion.y;
            }
            break;

        case SDL_MOUSEBUTTONDOWN:
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEBUTTONUP:
            event12.type = SDL12_MOUSEBUTTONUP;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEWHEEL:
            if (event20->wheel.y == 0) {
                break;  /* don't support horizontal wheels in 1.2. */
            }
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->wheel.which;
            event12.button.button = (event20->wheel.y > 0) ? 4 : 5;  /* wheelup is 4, down is 5. */
            event12.button.state = SDL_PRESSED;
            event12.button.x = MousePosition.x;
            event12.button.y = MousePosition.y;
            PushEventIfNotFiltered(&event12);

            event12.type = SDL12_MOUSEBUTTONUP;  /* immediately release mouse "button" at the end of this switch. */
            event12.button.state = SDL_RELEASED;
            break;

        case SDL_JOYAXISMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jaxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->jaxis.axis;
                    event12.jaxis.value = event20->jaxis.value;
                }
            }
            break;

        case SDL_JOYBALLMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jball.which);
                if (which != -1) {
                    event12.type = SDL12_JOYBALLMOTION;
                    event12.jball.which = (Uint8) which;
                    event12.jball.ball = event20->jball.ball;
                    event12.jball.xrel = event20->jball.xrel;
                    event12.jball.yrel = event20->jball.yrel;
                }
            }
            break;

        case SDL_JOYHATMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jhat.which);
                if (which != -1) {
                    event12.type = SDL12_JOYHATMOTION;
                    event12.jhat.which = (Uint8) which;
                    event12.jhat.hat = event20->jhat.hat;
                    event12.jhat.value = event20->jhat.value;
                }
            }
            break;

        case SDL_JOYBUTTONDOWN:
        case SDL_JOYBUTTONUP:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jbutton.which);
                if (which != -1) {
                    event12.type = (event20->jbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->jbutton.button;
                    event12.jbutton.state = event20->jbutton.state;
                }
            }
            break;

        case SDL_CONTROLLERAXISMOTION:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->caxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->caxis.axis;
                    event12.jaxis.value = event20->caxis.value;
                }
            }
            break;

        case SDL_CONTROLLERBUTTONDOWN:
        case SDL_CONTROLLERBUTTONUP:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->cbutton.which);
                if (which != -1) {
                    event12.type = (event20->cbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->cbutton.button;
                    event12.jbutton.state = event20->cbutton.state;
                }
            }
            break;


        /*
        case SDL_JOYDEVICEADDED:
        case SDL_JOYDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEREMAPPED:
        case SDL_FINGERDOWN:
        case SDL_FINGERUP:
        case SDL_FINGERMOTION:
        case SDL_DOLLARGESTURE:
        case SDL_DOLLARRECORD:
        case SDL_MULTIGESTURE:
        case SDL_CLIPBOARDUPDATE:
        case SDL_DROPFILE:
        */

        default:
            return 1;  /* drop everything else. */
    }

    PushEventIfNotFiltered(&event12);

    /* always pass it to the 2.0 event queue, as internal watchers (like the render API)
       might need to see these events to deal with logical scaling, etc. We've already
       copied it to the separate 1.2 event queue, and run the app's 1.2 event filter.
       Next time we call 1.2's SDL_PollEvent or SDL_PumpEvents(), we'll throw away the
       entire SDL2 event queue, as everything that cares about those will have then
       had a chance to examine it. */
    return 1;
}